

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int unfixable_trouble_count(boolean is_horn)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (u.uprops[0x21].intrinsic != 0) + 1;
  if (u.uprops[0x22].intrinsic == 0) {
    uVar2 = (uint)(u.uprops[0x21].intrinsic != 0);
  }
  iVar1 = ((u.usteed == (monst *)0x0 &&
           (u.uprops[0x20].extrinsic != 0 || u.uprops[0x20].intrinsic != 0)) + uVar2 + 1) -
          (uint)(u.uprops[0x3a].intrinsic == 0);
  if (is_horn != '\0') {
    return iVar1;
  }
  return (((((iVar1 - (uint)(u.uprops[0x1c].intrinsic == 0)) - (uint)(u.uprops[0x1d].intrinsic == 0)
            ) - (uint)(u.uprops[0x23].intrinsic == 0)) - (uint)(u.uprops[0x2f].intrinsic == 0)) + 5)
         - (uint)(u.uprops[0x1b].intrinsic == 0);
}

Assistant:

int unfixable_trouble_count(boolean is_horn)
{
	int unfixable_trbl = 0;

	if (Stoned) unfixable_trbl++;
	if (Strangled) unfixable_trbl++;
	if (Wounded_legs && !u.usteed) unfixable_trbl++;
	if (Slimed) unfixable_trbl++;
	/* lycanthropy is not desirable, but it doesn't actually make you feel
	   bad */

	/* we'll assume that intrinsic stunning from being a bat/stalker
	   doesn't make you feel bad */
	if (!is_horn) {
	    if (Confusion) unfixable_trbl++;
	    if (Sick) unfixable_trbl++;
	    if (HHallucination) unfixable_trbl++;
	    if (Vomiting) unfixable_trbl++;
	    if (HStun) unfixable_trbl++;
	}
	return unfixable_trbl;
}